

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>>::
emplace<QModelIndex_const&,QModelIndex&>
          (QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>> *this,qsizetype i,
          QModelIndex *args,QModelIndex *args_1)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  quintptr qVar4;
  QPersistentModelIndex QVar5;
  long in_FS_OFFSET;
  Inserter local_80;
  undefined8 local_58;
  quintptr qStack_50;
  QAbstractItemModel *local_48;
  QPersistentModelIndex local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0049b9f9:
    local_40[0].d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_4_ = args->r;
    local_58._4_4_ = args->c;
    qStack_50 = args->i;
    local_48 = (args->m).ptr;
    QPersistentModelIndex::QPersistentModelIndex(local_40,args_1);
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(pair<QModelIndex,_QPersistentModelIndex> **)0x0,
               (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0);
    QVar5.d = local_40[0].d;
    if (i == 0 && lVar3 != 0) {
      lVar3 = *(long *)(this + 8);
      *(QAbstractItemModel **)(lVar3 + -0x10) = local_48;
      *(undefined8 *)(lVar3 + -0x20) = local_58;
      *(quintptr *)(lVar3 + -0x18) = qStack_50;
      local_40[0].d = (QPersistentModelIndexData *)0x0;
      *(QPersistentModelIndexData **)(lVar3 + -8) = QVar5.d;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      local_80.displaceFrom =
           (pair<QModelIndex,_QPersistentModelIndex> *)(*(long *)(this + 8) + i * 0x20);
      local_80.displaceTo =
           (pair<QModelIndex,_QPersistentModelIndex> *)(*(long *)(this + 8) + i * 0x20 + 0x20);
      local_80.nInserts = 1;
      local_80.bytes = (*(long *)(this + 0x10) - i) * 0x20;
      local_80.data = (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      QVar5.d = local_40[0].d;
      ((local_80.displaceFrom)->first).r = (undefined4)local_58;
      ((local_80.displaceFrom)->first).c = local_58._4_4_;
      ((local_80.displaceFrom)->first).i = qStack_50;
      ((local_80.displaceFrom)->first).m.ptr = local_48;
      local_40[0].d = (QPersistentModelIndexData *)0x0;
      ((local_80.displaceFrom)->second).d = QVar5.d;
      local_80.displaceFrom = local_80.displaceFrom + 1;
      QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::~Inserter
                (&local_80);
    }
    QPersistentModelIndex::~QPersistentModelIndex(local_40);
  }
  else {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 5) + lVar3)) {
      puVar1 = (undefined8 *)(*(long *)(this + 8) + lVar3 * 0x20);
      puVar1[2] = (args->m).ptr;
      qVar4 = args->i;
      *puVar1 = *(undefined8 *)args;
      puVar1[1] = qVar4;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(puVar1 + 3),args_1);
    }
    else {
      if (((i != 0) || (piVar2 == (int *)0x0)) ||
         (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0049b9f9;
      lVar3 = *(long *)(this + 8);
      *(QAbstractItemModel **)(lVar3 + -0x10) = (args->m).ptr;
      qVar4 = args->i;
      *(undefined8 *)(lVar3 + -0x20) = *(undefined8 *)args;
      *(quintptr *)(lVar3 + -0x18) = qVar4;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(lVar3 + -8),args_1);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }